

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void vkt::Draw::createDrawTests(TestCaseGroup *testGroup)

{
  TestContext *testCtx;
  TestNode *node;
  int iVar1;
  int *piVar2;
  allocator<char> local_7a;
  allocator<char> local_79;
  TestNode *local_78;
  char *local_70 [4];
  char *local_50 [4];
  
  piVar2 = &DAT_009d139c;
  iVar1 = 0;
  local_78 = &testGroup->super_TestNode;
  for (; iVar1 != 4; iVar1 = iVar1 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,(char *)((long)&DAT_009d139c + (long)*piVar2),&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,"Group for testing a specific draw command.",&local_7a);
    testCtx = local_78->m_testCtx;
    node = (TestNode *)operator_new(0x80);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,testCtx,local_50[0],local_70[0]);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c059f0;
    node[1]._vptr_TestNode = (_func_int **)createTopologyGroups;
    *(int *)&node[1].m_testCtx = iVar1;
    tcu::TestNode::addChild(local_78,node);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)local_50);
    piVar2 = piVar2 + 1;
  }
  return;
}

Assistant:

void createDrawTests (tcu::TestCaseGroup* testGroup)
{
	for (deUint32 idx = 0; idx < DRAW_COMMAND_TYPE_DRAW_LAST; ++idx)
	{
		const DrawCommandType	command	= DrawCommandType(idx);
		addTestGroup(testGroup, getDrawCommandTypeName(command), "Group for testing a specific draw command.", createTopologyGroups, command);
	}
}